

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

int ZSTD_seqToCodes(seqStore_t *seqStorePtr)

{
  ushort uVar1;
  ushort uVar2;
  seqDef *psVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  uint uVar7;
  U32 UVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  U32 mlv;
  U32 ofCode;
  U32 llv;
  int longOffsets;
  U32 u;
  U32 nbSeq;
  BYTE *mlCodeTable;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  seqDef *sequences;
  seqStore_t *seqStorePtr_local;
  
  psVar3 = seqStorePtr->sequencesStart;
  pBVar4 = seqStorePtr->llCode;
  pBVar5 = seqStorePtr->ofCode;
  pBVar6 = seqStorePtr->mlCode;
  uVar10 = (long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart >> 3;
  ofCode = 0;
  if (seqStorePtr->maxNbSeq < (uVar10 & 0xffffffff)) {
    __assert_fail("nbSeq <= seqStorePtr->maxNbSeq",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xa55,"int ZSTD_seqToCodes(const seqStore_t *)");
  }
  llv = 0;
  do {
    if ((uint)uVar10 <= llv) {
      if (seqStorePtr->longLengthType == ZSTD_llt_literalLength) {
        pBVar4[seqStorePtr->longLengthPos] = '#';
      }
      if (seqStorePtr->longLengthType == ZSTD_llt_matchLength) {
        pBVar6[seqStorePtr->longLengthPos] = '4';
      }
      return ofCode;
    }
    uVar1 = psVar3[llv].litLength;
    uVar7 = ZSTD_highbit32(psVar3[llv].offBase);
    uVar2 = psVar3[llv].mlBase;
    UVar8 = ZSTD_LLcode((uint)uVar1);
    pBVar4[llv] = (BYTE)UVar8;
    pBVar5[llv] = (BYTE)uVar7;
    UVar8 = ZSTD_MLcode((uint)uVar2);
    pBVar6[llv] = (BYTE)UVar8;
    uVar9 = MEM_64bits();
    if (uVar9 != 0) {
      uVar9 = MEM_32bits();
      uVar11 = 0x39;
      if (uVar9 != 0) {
        uVar11 = 0x19;
      }
      if (uVar11 <= uVar7) {
        __assert_fail("!(MEM_64bits() && ofCode >= STREAM_ACCUMULATOR_MIN)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0xa5d,"int ZSTD_seqToCodes(const seqStore_t *)");
      }
    }
    uVar9 = MEM_32bits();
    if (uVar9 != 0) {
      uVar9 = MEM_32bits();
      uVar11 = 0x39;
      if (uVar9 != 0) {
        uVar11 = 0x19;
      }
      if (uVar11 <= uVar7) {
        ofCode = 1;
      }
    }
    llv = llv + 1;
  } while( true );
}

Assistant:

int ZSTD_seqToCodes(const seqStore_t* seqStorePtr)
{
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    BYTE* const llCodeTable = seqStorePtr->llCode;
    BYTE* const ofCodeTable = seqStorePtr->ofCode;
    BYTE* const mlCodeTable = seqStorePtr->mlCode;
    U32 const nbSeq = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    U32 u;
    int longOffsets = 0;
    assert(nbSeq <= seqStorePtr->maxNbSeq);
    for (u=0; u<nbSeq; u++) {
        U32 const llv = sequences[u].litLength;
        U32 const ofCode = ZSTD_highbit32(sequences[u].offBase);
        U32 const mlv = sequences[u].mlBase;
        llCodeTable[u] = (BYTE)ZSTD_LLcode(llv);
        ofCodeTable[u] = (BYTE)ofCode;
        mlCodeTable[u] = (BYTE)ZSTD_MLcode(mlv);
        assert(!(MEM_64bits() && ofCode >= STREAM_ACCUMULATOR_MIN));
        if (MEM_32bits() && ofCode >= STREAM_ACCUMULATOR_MIN)
            longOffsets = 1;
    }
    if (seqStorePtr->longLengthType==ZSTD_llt_literalLength)
        llCodeTable[seqStorePtr->longLengthPos] = MaxLL;
    if (seqStorePtr->longLengthType==ZSTD_llt_matchLength)
        mlCodeTable[seqStorePtr->longLengthPos] = MaxML;
    return longOffsets;
}